

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::
InternalSerializeMessageSetItemWithCachedSizesToArray
          (Extension *this,int number,uint8 *target,EpsCopyOutputStream *stream)

{
  MessageLite *pMVar1;
  uint32 value;
  int iVar2;
  LogMessage *other;
  uint8 *puVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage local_70;
  LogFinisher local_31;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar3[0] = '\v';
      puVar3[1] = '\x10';
      puVar3 = io::CodedOutputStream::WriteVarint32ToArray(number,puVar3 + 2);
      pMVar1 = (this->field_0).message_value;
      if ((this->field_0xa & 0x10) == 0) {
        *puVar3 = '\x1a';
        value = (*pMVar1->_vptr_MessageLite[10])(pMVar1);
        puVar3 = io::CodedOutputStream::WriteVarint32ToArray(value,puVar3 + 1);
        iVar2 = (*pMVar1->_vptr_MessageLite[0xc])(pMVar1,puVar3,stream);
        puVar3 = (uint8 *)CONCAT44(extraout_var,iVar2);
      }
      else {
        iVar2 = (*pMVar1->_vptr_MessageLite[0x11])(pMVar1,3,puVar3,stream);
        puVar3 = (uint8 *)CONCAT44(extraout_var_00,iVar2);
      }
      puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar3);
      *puVar3 = '\f';
      target = puVar3 + 1;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
               ,0x820);
    other = LogMessage::operator<<(&local_70,"Invalid message set extension.");
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_70);
    target = InternalSerializeFieldWithCachedSizesToArray(this,number,target,stream);
  }
  return target;
}

Assistant:

uint8*
ExtensionSet::Extension::InternalSerializeMessageSetItemWithCachedSizesToArray(
    int number, uint8* target, io::EpsCopyOutputStream* stream) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but serialize it the normal way.
    GOOGLE_LOG(WARNING) << "Invalid message set extension.";
    return InternalSerializeFieldWithCachedSizesToArray(number, target, stream);
  }

  if (is_cleared) return target;

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, number, target);
  // Write message.
  if (is_lazy) {
    target = lazymessage_value->WriteMessageToArray(
        WireFormatLite::kMessageSetMessageNumber, target, stream);
  } else {
    target = WireFormatLite::InternalWriteMessage(
        WireFormatLite::kMessageSetMessageNumber, *message_value, target,
        stream);
  }
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}